

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewSampling::TextureViewTestViewSampling
          (TextureViewTestViewSampling *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"view_sampling",
             "Verify that sampling data from texture views, that use internal format which is compatible with the original texture\'s internal format, works correctly."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021318a0;
  this->m_bo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_po_lod_location = -1;
  this->m_po_n_face_location = -1;
  this->m_po_reference_colors_location = -1;
  this->m_po_texture_location = -1;
  this->m_po_z_float_location = -1;
  this->m_po_z_int_location = -1;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  this->m_per_sample_filler_fs_id = 0;
  this->m_per_sample_filler_gs_id = 0;
  this->m_per_sample_filler_po_id = 0;
  this->m_per_sample_filler_po_layer_id_location = -1;
  this->m_per_sample_filler_po_reference_colors_location = -1;
  this->m_per_sample_filler_vs_id = 0;
  this->m_result_to_id = 0;
  this->m_to_id = 0;
  this->m_view_to_id = 0;
  this->m_fbo_id = 0;
  this->m_vao_id = 0;
  this->m_max_color_texture_samples_gl_value = 0;
  this->m_iteration_parent_texture_depth = 0;
  this->m_iteration_parent_texture_height = 0;
  this->m_iteration_parent_texture_n_levels = 0;
  this->m_iteration_parent_texture_n_samples = 0;
  this->m_iteration_parent_texture_target = 0;
  this->m_iteration_parent_texture_width = 0;
  this->m_iteration_view_texture_minlayer = 0;
  this->m_iteration_view_texture_numlayers = 0;
  this->m_iteration_view_texture_minlevel = 0;
  this->m_iteration_view_texture_numlevels = 0;
  this->m_iteration_view_texture_target = 0;
  this->m_reference_texture_depth = 4;
  this->m_reference_texture_height = 4;
  this->m_reference_texture_n_mipmaps = 3;
  this->m_reference_texture_width = 4;
  this->m_reference_color_storage = (_reference_color_storage *)0x0;
  this->m_result_data = (uchar *)0x0;
  return;
}

Assistant:

TextureViewTestViewSampling::TextureViewTestViewSampling(deqp::Context& context)
	: TestCase(context, "view_sampling", "Verify that sampling data from texture views, that use internal "
										 "format which is compatible with the original texture's internal "
										 "format, works correctly.")
	, m_bo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_po_lod_location(-1)
	, m_po_n_face_location(-1)
	, m_po_reference_colors_location(-1)
	, m_po_texture_location(-1)
	, m_po_z_float_location(-1)
	, m_po_z_int_location(-1)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
	, m_per_sample_filler_fs_id(0)
	, m_per_sample_filler_gs_id(0)
	, m_per_sample_filler_po_id(0)
	, m_per_sample_filler_po_layer_id_location(-1)
	, m_per_sample_filler_po_reference_colors_location(-1)
	, m_per_sample_filler_vs_id(0)
	, m_result_to_id(0)
	, m_to_id(0)
	, m_view_to_id(0)
	, m_fbo_id(0)
	, m_vao_id(0)
	, m_max_color_texture_samples_gl_value(0)
	, m_iteration_parent_texture_depth(0)
	, m_iteration_parent_texture_height(0)
	, m_iteration_parent_texture_n_levels(0)
	, m_iteration_parent_texture_n_samples(0)
	, m_iteration_parent_texture_target(GL_NONE)
	, m_iteration_parent_texture_width(0)
	, m_iteration_view_texture_minlayer(0)
	, m_iteration_view_texture_numlayers(0)
	, m_iteration_view_texture_minlevel(0)
	, m_iteration_view_texture_numlevels(0)
	, m_iteration_view_texture_target(GL_NONE)
	, m_reference_texture_depth(4)
	, m_reference_texture_height(4)
	, m_reference_texture_n_mipmaps(3)
	, m_reference_texture_width(4)
	, m_reference_color_storage(DE_NULL)
	, m_result_data(DE_NULL)
{
	/* Left blank on purpose */
}